

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_psbt.cpp
# Opt level: O3

void cfd::api::json::PsbtJsonApi::DecodePsbt
               (DecodePsbtRequest *request,DecodePsbtResponse *response)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer pcVar1;
  JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *pJVar2;
  pointer pBVar3;
  pointer pPVar4;
  pointer pKVar5;
  undefined8 uVar6;
  uint8_t uVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  NetType type;
  uint32_t uVar11;
  uint32_t uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  undefined **extraout_RAX;
  undefined **ppuVar14;
  int64_t iVar15;
  CfdException *pCVar16;
  KeyData *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  iterator __begin4;
  pointer __x;
  pointer pKVar18;
  undefined1 auVar19 [8];
  Amount AVar20;
  bool is_witness;
  Amount total_output;
  ByteData data;
  ByteData data_1;
  Transaction full_utxo;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  Script redeem_script;
  Psbt psbt;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> sig_pubkey_list;
  Script witness_script;
  Amount total_input;
  TxOut utxo;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> bip32_pubkey_list;
  string tx_hex;
  AddressFactory addr_factory;
  PsbtGlobalXpub xpub_obj;
  Transaction tx;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> xpub_list;
  PsbtMapData item;
  DecodeRawTransactionRequest tx_req;
  DecodeRawTransactionResponse tx_res;
  bool local_bb1;
  DecodePsbtResponse *local_bb0;
  DecodePsbtRequest *local_ba8;
  undefined1 local_ba0 [32];
  vector<cfd::api::json::PsbtGlobalXpub,std::allocator<cfd::api::json::PsbtGlobalXpub>> *local_b80;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_b78;
  ulong local_b60;
  undefined1 local_b58 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_b50;
  undefined1 local_b48 [24];
  pointer local_b30;
  string local_b20 [8];
  pointer local_b18;
  pointer local_b00 [31];
  Pubkey local_a08;
  Transaction local_9f0;
  uint32_t local_9ac;
  undefined1 local_9a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_9a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_998 [2];
  string local_970 [32];
  string local_950 [32];
  string local_930 [32];
  string local_910 [32];
  undefined1 local_8f0 [56];
  Psbt local_8b8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_868;
  Script local_850;
  Amount local_818;
  vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
  *local_808;
  AbstractTxOut local_800;
  string local_7b0;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_790;
  string local_778;
  AddressFactory local_758;
  undefined1 local_730 [8];
  int local_728 [2];
  char *local_720 [5];
  string local_6f8 [56];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [24];
  string local_628 [32];
  string local_608 [72];
  vector<cfd::api::json::PsbtBip32Data,std::allocator<cfd::api::json::PsbtBip32Data>> local_5c0 [32]
  ;
  pointer local_5a0;
  pointer local_598;
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [40];
  vector<cfd::api::json::PsbtSignatureData,std::allocator<cfd::api::json::PsbtSignatureData>>
  local_508 [24];
  string local_4f0 [88];
  string local_498 [32];
  string local_478 [32];
  string local_458 [88];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [40];
  vector<cfd::api::json::PsbtBip32Data,std::allocator<cfd::api::json::PsbtBip32Data>> local_398 [80]
  ;
  string local_348 [32];
  string local_328 [40];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_300 [32];
  pointer local_2e0;
  pointer local_2d8;
  Transaction local_2c8;
  undefined1 local_288 [24];
  Script local_270 [2];
  undefined1 local_1f8 [88];
  string local_1a0 [32];
  undefined1 local_180 [88];
  string local_128 [40];
  DecodeRawTransactionResponse local_100;
  
  local_ba8 = request;
  if (request == (DecodePsbtRequest *)0x0) {
    pCVar16 = (CfdException *)__cxa_allocate_exception(0x30);
    local_730 = (undefined1  [8])local_720;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"request is null.","");
    core::CfdException::CfdException(pCVar16,kCfdIllegalArgumentError,(string *)local_730);
    __cxa_throw(pCVar16,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_bb0 = response;
  if (response == (DecodePsbtResponse *)0x0) {
    pCVar16 = (CfdException *)__cxa_allocate_exception(0x30);
    local_730 = (undefined1  [8])local_720;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"response is null.","");
    core::CfdException::CfdException(pCVar16,kCfdIllegalArgumentError,(string *)local_730);
    __cxa_throw(pCVar16,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  pcVar1 = (request->psbt_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7b0,pcVar1,pcVar1 + (request->psbt_)._M_string_length);
  if (local_7b0._M_string_length == 0) {
    local_730 = (undefined1  [8])0x5e7772;
    local_728[0] = 0x44;
    local_720[0] = "DecodePsbt";
    core::logger::log<>((CfdSourceLocation *)local_730,kCfdLogLevelWarning,
                        "Failed to DecodePsbt. empty psbt.");
    pCVar16 = (CfdException *)__cxa_allocate_exception(0x30);
    local_730 = (undefined1  [8])local_720;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_730,"Invalid hex string. empty data.","");
    core::CfdException::CfdException(pCVar16,kCfdIllegalArgumentError,(string *)local_730);
    __cxa_throw(pCVar16,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_730 = (undefined1  [8])local_720;
  pcVar1 = (request->network_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_730,pcVar1,pcVar1 + (request->network_)._M_string_length);
  type = TransactionJsonApi::ConvertNetType((string *)local_730);
  if (local_730 != (undefined1  [8])local_720) {
    operator_delete((void *)local_730);
  }
  AddressFactory::AddressFactory(&local_758,type);
  core::Psbt::Psbt(&local_8b8,&local_7b0);
  core::Psbt::GetTransaction(&local_2c8,&local_8b8);
  DecodeRawTransactionRequest::DecodeRawTransactionRequest((DecodeRawTransactionRequest *)local_180)
  ;
  DecodeRawTransactionResponse::DecodeRawTransactionResponse(&local_100);
  PsbtMapData::PsbtMapData((PsbtMapData *)local_1f8);
  core::AbstractTransaction::GetHex_abi_cxx11_(&local_778,&local_2c8.super_AbstractTransaction);
  std::__cxx11::string::_M_assign((string *)(local_180 + 0x38));
  local_730 = (undefined1  [8])local_720;
  pcVar1 = (local_ba8->network_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_730,pcVar1,pcVar1 + (local_ba8->network_)._M_string_length);
  std::__cxx11::string::_M_assign(local_128);
  if (local_730 != (undefined1  [8])local_720) {
    operator_delete((void *)local_730);
  }
  TransactionJsonApi::DecodeRawTransaction((DecodeRawTransactionRequest *)local_180,&local_100);
  DecodePsbtResponse::SetTx(local_bb0,&local_100);
  if (local_ba8->has_detail_ == true) {
    std::__cxx11::string::_M_assign((string *)&local_bb0->tx_hex_);
    if (local_ba8->has_simple_ != true) goto LAB_00463400;
    local_730 = (undefined1  [8])local_720;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"tx","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_bb0->ignore_items,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730);
  }
  else {
    local_730 = (undefined1  [8])local_720;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"tx_hex","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_bb0->ignore_items,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730);
  }
  if (local_730 != (undefined1  [8])local_720) {
    operator_delete((void *)local_730);
  }
LAB_00463400:
  core::Psbt::GetGlobalRecordKeyList(&local_b78,&local_8b8);
  if (local_ba8->has_detail_ == true) {
    uVar11 = core::Psbt::GetPsbtVersion(&local_8b8);
    local_bb0->version_ = uVar11;
    core::Psbt::GetGlobalXpubkeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_288,
               &local_8b8);
    uVar6 = local_288._8_8_;
    if (local_288._0_8_ != local_288._8_8_) {
      local_b80 = (vector<cfd::api::json::PsbtGlobalXpub,std::allocator<cfd::api::json::PsbtGlobalXpub>>
                   *)&(local_bb0->xpubs_).super_JsonVector<cfd::api::json::PsbtGlobalXpub>.
                      super_vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
      ;
      this_00 = (KeyData *)local_288._0_8_;
      do {
        core::KeyData::GetExtPubkey((ExtPubkey *)local_b58,this_00);
        PsbtGlobalXpub::PsbtGlobalXpub((PsbtGlobalXpub *)local_730);
        core::ExtPubkey::ToString_abi_cxx11_((string *)local_9a8,(ExtPubkey *)local_b58);
        std::__cxx11::string::_M_assign(local_6c0);
        if (local_9a8 != (undefined1  [8])local_998) {
          operator_delete((void *)local_9a8);
        }
        core::ExtPubkey::GetData((ByteData *)&local_800,(ExtPubkey *)local_b58);
        core::ByteData::GetHex_abi_cxx11_((string *)local_9a8,(ByteData *)&local_800);
        std::__cxx11::string::_M_assign(local_6a0);
        if (local_9a8 != (undefined1  [8])local_998) {
          operator_delete((void *)local_9a8);
        }
        if ((vector<cfd::api::json::PsbtGlobalXpub,std::allocator<cfd::api::json::PsbtGlobalXpub>> *
            )local_800._vptr_AbstractTxOut !=
            (vector<cfd::api::json::PsbtGlobalXpub,std::allocator<cfd::api::json::PsbtGlobalXpub>> *
            )0x0) {
          operator_delete(local_800._vptr_AbstractTxOut);
        }
        core::KeyData::GetBip32Path_abi_cxx11_((string *)local_9a8,this_00,kApostrophe,false);
        std::__cxx11::string::_M_assign(local_660);
        if (local_9a8 != (undefined1  [8])local_998) {
          operator_delete((void *)local_9a8);
        }
        core::KeyData::GetFingerprint((ByteData *)&local_800,this_00);
        core::ByteData::GetHex_abi_cxx11_((string *)local_9a8,(ByteData *)&local_800);
        std::__cxx11::string::_M_assign(local_680);
        if (local_9a8 != (undefined1  [8])local_998) {
          operator_delete((void *)local_9a8);
        }
        if ((vector<cfd::api::json::PsbtGlobalXpub,std::allocator<cfd::api::json::PsbtGlobalXpub>> *
            )local_800._vptr_AbstractTxOut !=
            (vector<cfd::api::json::PsbtGlobalXpub,std::allocator<cfd::api::json::PsbtGlobalXpub>> *
            )0x0) {
          operator_delete(local_800._vptr_AbstractTxOut);
        }
        core::KeyData::ToString_abi_cxx11_((string *)local_9a8,this_00,true,kApostrophe,false);
        std::__cxx11::string::_M_assign(local_640);
        if (local_9a8 != (undefined1  [8])local_998) {
          operator_delete((void *)local_9a8);
        }
        std::vector<cfd::api::json::PsbtGlobalXpub,std::allocator<cfd::api::json::PsbtGlobalXpub>>::
        emplace_back<cfd::api::json::PsbtGlobalXpub&>(local_b80,(PsbtGlobalXpub *)local_730);
        PsbtGlobalXpub::~PsbtGlobalXpub((PsbtGlobalXpub *)local_730);
        if (local_b00[0] != (pointer)0x0) {
          operator_delete(local_b00[0]);
        }
        if (local_b18 != (pointer)0x0) {
          operator_delete(local_b18);
        }
        if (local_b30 != (pointer)0x0) {
          operator_delete(local_b30);
        }
        if (local_b58 != (undefined1  [8])0x0) {
          operator_delete((void *)local_b58);
        }
        this_00 = this_00 + 1;
      } while (this_00 != (KeyData *)uVar6);
    }
    if ((local_bb0->xpubs_).super_JsonVector<cfd::api::json::PsbtGlobalXpub>.
        super_vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
        .
        super__Vector_base<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (local_bb0->xpubs_).super_JsonVector<cfd::api::json::PsbtGlobalXpub>.
        super_vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
        .
        super__Vector_base<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_730 = (undefined1  [8])local_720;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"xpubs","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_bb0->ignore_items,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730);
      if (local_730 != (undefined1  [8])local_720) {
        operator_delete((void *)local_730);
      }
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_288);
  }
  else {
    local_730 = (undefined1  [8])local_720;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"version","");
    this = &local_bb0->ignore_items;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_730);
    if (local_730 != (undefined1  [8])local_720) {
      operator_delete((void *)local_730);
    }
    local_730 = (undefined1  [8])local_720;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"xpubs","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_730);
    if (local_730 != (undefined1  [8])local_720) {
      operator_delete((void *)local_730);
    }
    uVar11 = core::Psbt::GetPsbtVersion(&local_8b8);
    if (uVar11 != 0) {
      local_730 = (undefined1  [8])local_720;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"fb","");
      core::ByteData::ByteData((ByteData *)local_b58,(string *)local_730);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(&local_b78,(ByteData *)local_b58);
      if (local_b58 != (undefined1  [8])0x0) {
        operator_delete((void *)local_b58);
      }
      if (local_730 != (undefined1  [8])local_720) {
        operator_delete((void *)local_730);
      }
    }
  }
  uVar11 = core::Psbt::GetPsbtVersion(&local_8b8);
  if (uVar11 != 0) {
    local_730 = (undefined1  [8])local_720;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"fb","");
    core::ByteData::ByteData((ByteData *)local_b58,(string *)local_730);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
    emplace_back<cfd::core::ByteData>(&local_b78,(ByteData *)local_b58);
    if (local_b58 != (undefined1  [8])0x0) {
      operator_delete((void *)local_b58);
    }
    if (local_730 != (undefined1  [8])local_720) {
      operator_delete((void *)local_730);
    }
  }
  pBVar3 = local_b78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_b78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_b78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pJVar2 = &local_bb0->unknown_;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b78.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    do {
      if ((local_ba8->has_detail_ != true) ||
         (uVar7 = core::ByteData::GetHeadData((ByteData *)paVar13), uVar7 != '\x01')) {
        core::Psbt::GetGlobalRecord((ByteData *)local_b58,&local_8b8,(ByteData *)paVar13);
        core::ByteData::GetHex_abi_cxx11_((string *)local_730,(ByteData *)paVar13);
        std::__cxx11::string::_M_assign((string *)(local_1f8 + 0x38));
        if (local_730 != (undefined1  [8])local_720) {
          operator_delete((void *)local_730);
        }
        core::ByteData::GetHex_abi_cxx11_((string *)local_730,(ByteData *)local_b58);
        std::__cxx11::string::_M_assign(local_1a0);
        if (local_730 != (undefined1  [8])local_720) {
          operator_delete((void *)local_730);
        }
        std::vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>>::
        emplace_back<cfd::api::json::PsbtMapData&>
                  ((vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>>
                    *)&(pJVar2->super_JsonVector<cfd::api::json::PsbtMapData>).
                       super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
                   ,(PsbtMapData *)local_1f8);
        if (local_b58 != (undefined1  [8])0x0) {
          operator_delete((void *)local_b58);
        }
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar13->_M_local_buf + 0x18);
    } while (paVar13 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pBVar3);
  }
  if ((local_ba8->has_simple_ != false) &&
     ((local_bb0->unknown_).super_JsonVector<cfd::api::json::PsbtMapData>.
      super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
      super__Vector_base<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (local_bb0->unknown_).super_JsonVector<cfd::api::json::PsbtMapData>.
      super_vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
      super__Vector_base<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_730 = (undefined1  [8])local_720;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"unknown","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_bb0->ignore_items,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730);
    if (local_730 != (undefined1  [8])local_720) {
      operator_delete((void *)local_730);
    }
  }
  core::Amount::Amount(&local_818);
  uVar11 = core::Transaction::GetTxInCount(&local_2c8);
  if (uVar11 == 0) {
    local_b60 = 0;
  }
  else {
    uVar12 = 0;
    local_b80 = (vector<cfd::api::json::PsbtGlobalXpub,std::allocator<cfd::api::json::PsbtGlobalXpub>>
                 *)&PTR__AbstractTxOut_0072e7f0;
    local_808 = &(local_bb0->inputs_).super_JsonVector<cfd::api::json::DecodePsbtInput>.
                 super_vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
    ;
    local_b60 = 0;
    local_9ac = uVar11;
    do {
      DecodePsbtInput::DecodePsbtInput((DecodePsbtInput *)local_730);
      core::Transaction::GetTxIn((TxInReference *)local_288,&local_2c8,uVar12);
      local_bb1 = false;
      core::Psbt::GetTxInUtxo((TxOut *)&local_800,&local_8b8,uVar12,true,&local_bb1);
      core::AbstractTxOut::GetLockingScript((Script *)local_b58,&local_800);
      bVar8 = core::Script::IsEmpty((Script *)local_b58);
      bVar9 = local_bb1 ^ 1;
      core::Script::~Script((Script *)local_b58);
      if (bVar8 || (bVar9 & 1) != 0) {
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"witness_utxo","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b48;
        auVar19 = local_b58;
      }
      else {
        AVar20 = core::AbstractTxOut::GetValue(&local_800);
        local_b58 = (undefined1  [8])AVar20.amount_;
        paStack_b50._0_1_ = AVar20.ignore_check_;
        core::Amount::operator+=(&local_818,(Amount *)local_b58);
        AVar20 = core::AbstractTxOut::GetValue(&local_800);
        local_b58 = (undefined1  [8])AVar20.amount_;
        paStack_b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(paStack_b50._1_7_,AVar20.ignore_check_);
        local_608._56_8_ = core::Amount::GetSatoshiValue((Amount *)local_b58);
        local_9a8 = (undefined1  [8])local_998;
        paStack_9a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_998[0]._M_allocated_capacity = local_998[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
        core::AbstractTxOut::GetLockingScript((Script *)local_b58,&local_800);
        TransactionJsonApi::ConvertFromLockingScript
                  ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)local_8f0,
                   &local_758,(Script *)local_b58,(string *)local_9a8,(int64_t *)0x0);
        core::Script::~Script((Script *)local_b58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_8f0._9_7_,local_8f0[8])) {
          core::Address::GetAddress_abi_cxx11_((string *)local_b58,(Address *)local_8f0._0_8_);
          std::__cxx11::string::_M_assign(local_530);
          if (local_b58 != (undefined1  [8])local_b48) {
            operator_delete((void *)local_b58);
          }
        }
        core::AbstractTxOut::GetLockingScript((Script *)local_b58,&local_800);
        core::Script::GetHex_abi_cxx11_((string *)&local_9f0,(Script *)local_b58);
        std::__cxx11::string::_M_assign(local_570);
        if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
            local_9f0.super_AbstractTransaction._vptr_AbstractTransaction != &local_9f0.vin_) {
          operator_delete(local_9f0.super_AbstractTransaction._vptr_AbstractTransaction);
        }
        core::Script::~Script((Script *)local_b58);
        core::AbstractTxOut::GetLockingScript((Script *)local_b58,&local_800);
        core::Script::ToString_abi_cxx11_((string *)&local_9f0,(Script *)local_b58);
        std::__cxx11::string::_M_assign(local_590);
        if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
            local_9f0.super_AbstractTransaction._vptr_AbstractTransaction != &local_9f0.vin_) {
          operator_delete(local_9f0.super_AbstractTransaction._vptr_AbstractTransaction);
        }
        core::Script::~Script((Script *)local_b58);
        std::__cxx11::string::_M_assign(local_550);
        std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
                  ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)local_8f0);
        paVar13 = local_998;
        auVar19 = local_9a8;
      }
      if (auVar19 != (undefined1  [8])paVar13) {
        operator_delete((void *)auVar19);
      }
      core::Psbt::GetTxInUtxoFull(&local_9f0,&local_8b8,uVar12,true,(bool *)0x0);
      core::AbstractTransaction::GetTxid((Txid *)local_b58,&local_9f0.super_AbstractTransaction);
      core::Txid::Txid((Txid *)local_9a8,(Txid *)(local_288 + 8));
      bVar10 = core::Txid::Equals((Txid *)local_b58,(Txid *)local_9a8);
      local_9a8 = (undefined1  [8])&PTR__Txid_00723450;
      if (paStack_9a0 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(paStack_9a0);
      }
      local_b58 = (undefined1  [8])&PTR__Txid_00723450;
      if (paStack_b50 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(paStack_b50);
      }
      if (bVar10) {
        core::AbstractTransaction::GetHex_abi_cxx11_
                  ((string *)local_9a8,&local_9f0.super_AbstractTransaction);
        std::__cxx11::string::_M_assign((string *)(local_180 + 0x38));
        local_b58 = (undefined1  [8])local_b48;
        pcVar1 = (local_ba8->network_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b58,pcVar1,pcVar1 + (local_ba8->network_)._M_string_length);
        std::__cxx11::string::_M_assign(local_128);
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
        TransactionJsonApi::DecodeRawTransaction
                  ((DecodeRawTransactionRequest *)local_180,&local_100);
        DecodePsbtInput::SetNon_witness_utxo((DecodePsbtInput *)local_730,&local_100);
        if (local_ba8->has_detail_ == true) {
          std::__cxx11::string::_M_assign(local_6f8);
          if (paStack_9a0 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            local_b58 = (undefined1  [8])local_b48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b58,"non_witness_utxo_hex","");
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_728,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_b58);
            if (local_b58 != (undefined1  [8])local_b48) {
              operator_delete((void *)local_b58);
            }
          }
          if (local_ba8->has_simple_ == true) {
            local_b58 = (undefined1  [8])local_b48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b58,"non_witness_utxo","");
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_728,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_b58);
            goto LAB_00463f81;
          }
        }
        else {
          local_b58 = (undefined1  [8])local_b48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b58,"non_witness_utxo_hex","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_728,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58)
          ;
LAB_00463f81:
          if (local_b58 != (undefined1  [8])local_b48) {
            operator_delete((void *)local_b58);
          }
        }
        if (bVar8 || (bVar9 & 1) != 0) {
          uVar11 = core::Transaction::GetTxOutCount(&local_9f0);
          if ((uint)local_270[0].script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish < uVar11) {
            core::Transaction::GetTxOut
                      ((TxOutReference *)local_b58,&local_9f0,
                       (uint)local_270[0].script_data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
            local_8f0._0_8_ = paStack_b50;
            local_8f0[8] = (bool)local_b48[0];
            core::Amount::operator+=(&local_818,(Amount *)local_8f0);
            local_b58 = (undefined1  [8])&PTR__AbstractTxOutReference_00723740;
            core::Script::~Script((Script *)(local_b48 + 8));
          }
          else {
            local_b58 = (undefined1  [8])local_b48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b58,"non_witness_utxo","");
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_728,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_b58);
            ppuVar14 = (undefined **)local_b48;
            if (local_b58 != (undefined1  [8])ppuVar14) {
              operator_delete((void *)local_b58);
              ppuVar14 = extraout_RAX;
            }
            local_b60 = CONCAT71((int7)((ulong)ppuVar14 >> 8),1);
          }
        }
        if (local_9a8 != (undefined1  [8])local_998) {
          operator_delete((void *)local_9a8);
        }
      }
      else {
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"non_witness_utxo","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b58,"non_witness_utxo_hex","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
        local_b60 = CONCAT71((int7)(local_b60 >> 8),(byte)local_b60 | bVar8 | bVar9);
      }
      core::Psbt::GetTxInSignaturePubkeyList(&local_868,&local_8b8,uVar12);
      pPVar4 = local_868.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      __x = (pointer)CONCAT71(local_868.
                              super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              (char)local_868.
                                    super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      if (__x == local_868.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"partial_signatures","")
        ;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
      }
      else {
        do {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8f0,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
          core::Psbt::GetTxInSignature((ByteData *)&local_850,&local_8b8,uVar12,(Pubkey *)local_8f0)
          ;
          PsbtSignatureData::PsbtSignatureData((PsbtSignatureData *)local_b58);
          core::Pubkey::GetHex_abi_cxx11_((string *)local_9a8,(Pubkey *)local_8f0);
          std::__cxx11::string::_M_assign(local_b20);
          if (local_9a8 != (undefined1  [8])local_998) {
            operator_delete((void *)local_9a8);
          }
          core::ByteData::GetHex_abi_cxx11_((string *)local_9a8,(ByteData *)&local_850);
          std::__cxx11::string::_M_assign((string *)local_b00);
          if (local_9a8 != (undefined1  [8])local_998) {
            operator_delete((void *)local_9a8);
          }
          std::
          vector<cfd::api::json::PsbtSignatureData,std::allocator<cfd::api::json::PsbtSignatureData>>
          ::emplace_back<cfd::api::json::PsbtSignatureData&>
                    (local_508,(PsbtSignatureData *)local_b58);
          PsbtSignatureData::~PsbtSignatureData((PsbtSignatureData *)local_b58);
          if (local_850._vptr_Script != (_func_int **)0x0) {
            operator_delete(local_850._vptr_Script);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8f0._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_8f0._0_8_);
          }
          __x = __x + 1;
        } while (__x != pPVar4);
      }
      bVar8 = core::Psbt::IsFindTxInSighashType(&local_8b8,uVar12);
      if (bVar8) {
        core::Psbt::GetTxInSighashType((Psbt *)local_9a8,(uint32_t)&local_8b8);
        core::SigHashType::ToString_abi_cxx11_((string *)local_b58,(SigHashType *)local_9a8);
        std::__cxx11::string::_M_assign(local_4f0);
      }
      else {
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"sighash","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
      }
      if (local_b58 != (undefined1  [8])local_b48) {
        operator_delete((void *)local_b58);
      }
      core::Psbt::GetTxInRedeemScriptDirect((Script *)local_8f0,&local_8b8,uVar12,true,false);
      bVar8 = core::Script::IsEmpty((Script *)local_8f0);
      if (bVar8) {
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"redeem_script","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
      }
      else {
        local_b58 = (undefined1  [8])local_b48;
        paStack_b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_b48._0_8_ = local_b48._0_8_ & 0xffffffffffffff00;
        TransactionJsonApi::ConvertFromLockingScript
                  ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)&local_850,
                   &local_758,(Script *)local_8f0,(string *)local_b58,(int64_t *)0x0);
        core::Script::GetHex_abi_cxx11_((string *)local_9a8,(Script *)local_8f0);
        std::__cxx11::string::_M_assign(local_478);
        if (local_9a8 != (undefined1  [8])local_998) {
          operator_delete((void *)local_9a8);
        }
        core::Script::ToString_abi_cxx11_((string *)local_9a8,(Script *)local_8f0);
        std::__cxx11::string::_M_assign(local_498);
        if (local_9a8 != (undefined1  [8])local_998) {
          operator_delete((void *)local_9a8);
        }
        std::__cxx11::string::_M_assign(local_458);
        std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
                  ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)&local_850);
      }
      if (local_b58 != (undefined1  [8])local_b48) {
        operator_delete((void *)local_b58);
      }
      core::Psbt::GetTxInRedeemScriptDirect(&local_850,&local_8b8,uVar12,true,true);
      bVar8 = core::Script::IsEmpty(&local_850);
      if (bVar8) {
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"witness_script","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
      }
      else {
        local_b58 = (undefined1  [8])local_b48;
        paStack_b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_b48._0_8_ = local_b48._0_8_ & 0xffffffffffffff00;
        TransactionJsonApi::ConvertFromLockingScript
                  ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)local_ba0,
                   &local_758,&local_850,(string *)local_b58,(int64_t *)0x0);
        core::Script::GetHex_abi_cxx11_((string *)local_9a8,&local_850);
        std::__cxx11::string::_M_assign(local_3e0);
        if (local_9a8 != (undefined1  [8])local_998) {
          operator_delete((void *)local_9a8);
        }
        core::Script::ToString_abi_cxx11_((string *)local_9a8,&local_850);
        std::__cxx11::string::_M_assign(local_400);
        if (local_9a8 != (undefined1  [8])local_998) {
          operator_delete((void *)local_9a8);
        }
        std::__cxx11::string::_M_assign(local_3c0);
        std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
                  ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)local_ba0);
      }
      if (local_b58 != (undefined1  [8])local_b48) {
        operator_delete((void *)local_b58);
      }
      core::Psbt::GetTxInKeyDataList(&local_790,&local_8b8,uVar12);
      pKVar5 = local_790.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pKVar18 = local_790.
                super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_790.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_790.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"bip32_derivs","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
      }
      else {
        do {
          core::KeyData::KeyData((KeyData *)local_b58,pKVar18);
          PsbtBip32Data::PsbtBip32Data((PsbtBip32Data *)local_9a8);
          core::KeyData::GetPubkey(&local_a08,(KeyData *)local_b58);
          core::Pubkey::GetHex_abi_cxx11_((string *)local_ba0,&local_a08);
          std::__cxx11::string::_M_assign(local_970);
          if ((ByteData *)local_ba0._0_8_ != (ByteData *)(local_ba0 + 0x10)) {
            operator_delete((void *)local_ba0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a08.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_a08.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          core::KeyData::GetFingerprint(&local_a08.data_,(KeyData *)local_b58);
          core::ByteData::GetHex_abi_cxx11_((string *)local_ba0,&local_a08.data_);
          std::__cxx11::string::_M_assign(local_950);
          if ((ByteData *)local_ba0._0_8_ != (ByteData *)(local_ba0 + 0x10)) {
            operator_delete((void *)local_ba0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a08.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_a08.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          core::KeyData::GetBip32Path_abi_cxx11_
                    ((string *)local_ba0,(KeyData *)local_b58,kApostrophe,false);
          std::__cxx11::string::_M_assign(local_930);
          if ((ByteData *)local_ba0._0_8_ != (ByteData *)(local_ba0 + 0x10)) {
            operator_delete((void *)local_ba0._0_8_);
          }
          if (local_ba8->has_detail_ == true) {
            core::KeyData::ToString_abi_cxx11_
                      ((string *)local_ba0,(KeyData *)local_b58,true,kApostrophe,false);
            std::__cxx11::string::_M_assign(local_910);
          }
          else {
            local_ba0._0_8_ = local_ba0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_ba0,"descriptor","");
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&paStack_9a0,(string *)local_ba0);
          }
          if ((ByteData *)local_ba0._0_8_ != (ByteData *)(local_ba0 + 0x10)) {
            operator_delete((void *)local_ba0._0_8_);
          }
          std::vector<cfd::api::json::PsbtBip32Data,std::allocator<cfd::api::json::PsbtBip32Data>>::
          emplace_back<cfd::api::json::PsbtBip32Data&>(local_398,(PsbtBip32Data *)local_9a8);
          PsbtBip32Data::~PsbtBip32Data((PsbtBip32Data *)local_9a8);
          core::KeyData::~KeyData((KeyData *)local_b58);
          pKVar18 = pKVar18 + 1;
        } while (pKVar18 != pKVar5);
      }
      core::Psbt::GetTxInFinalScript
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_ba0,
                 &local_8b8,uVar12,false);
      if ((local_ba0._0_8_ == local_ba0._8_8_) ||
         (bVar8 = core::ByteData::IsEmpty((ByteData *)local_ba0._0_8_), bVar8)) {
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"final_scriptsig","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
      }
      else {
        core::ByteData::GetHex_abi_cxx11_((string *)local_b58,(ByteData *)local_ba0._0_8_);
        std::__cxx11::string::_M_assign(local_328);
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
        core::Script::Script((Script *)local_b58,(ByteData *)local_ba0._0_8_);
        core::Script::ToString_abi_cxx11_((string *)local_9a8,(Script *)local_b58);
        std::__cxx11::string::_M_assign(local_348);
        if (local_9a8 != (undefined1  [8])local_998) {
          operator_delete((void *)local_9a8);
        }
        core::Script::~Script((Script *)local_b58);
      }
      core::Psbt::GetTxInFinalScript
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_9a8,
                 &local_8b8,uVar12,true);
      paVar13 = paStack_9a0;
      auVar19 = local_9a8;
      if (local_9a8 == (undefined1  [8])paStack_9a0) {
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b58,"final_scriptwitness","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
      }
      else {
        do {
          core::ByteData::GetHex_abi_cxx11_((string *)local_b58,(ByteData *)auVar19);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    (local_300,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58)
          ;
          if (local_b58 != (undefined1  [8])local_b48) {
            operator_delete((void *)local_b58);
          }
          auVar19 = (undefined1  [8])((long)auVar19 + 0x18);
        } while (auVar19 != (undefined1  [8])paVar13);
      }
      core::Psbt::GetTxInRecordKeyList
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_a08,
                 &local_8b8,uVar12);
      local_b48._0_8_ =
           local_b78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      paStack_b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b78.
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
      local_b58 = (undefined1  [8])
                  local_b78.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_b78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_a08.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_b78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)local_a08.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_b78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_a08.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_a08.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a08.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a08.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_b58);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_a08);
      pBVar3 = local_b78.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_b78.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          paVar13 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pBVar3;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar13->_M_local_buf + 0x18)) {
        core::Psbt::GetTxInRecord(&local_a08.data_,&local_8b8,uVar12,(ByteData *)paVar13);
        core::ByteData::GetHex_abi_cxx11_((string *)local_b58,(ByteData *)paVar13);
        std::__cxx11::string::_M_assign((string *)(local_1f8 + 0x38));
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
        core::ByteData::GetHex_abi_cxx11_((string *)local_b58,&local_a08.data_);
        std::__cxx11::string::_M_assign(local_1a0);
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
        std::vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>>::
        emplace_back<cfd::api::json::PsbtMapData&>
                  ((vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>>
                    *)&local_2e0,(PsbtMapData *)local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a08.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_a08.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (local_2e0 == local_2d8) {
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"unknown","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
      }
      std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
      ::push_back(local_808,(DecodePsbtInput *)local_730);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_9a8);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_ba0);
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_790);
      core::Script::~Script(&local_850);
      core::Script::~Script((Script *)local_8f0);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_868);
      core::Transaction::~Transaction(&local_9f0);
      local_800._vptr_AbstractTxOut = (_func_int **)local_b80;
      core::Script::~Script(&local_800.locking_script_);
      core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)local_288);
      DecodePsbtInput::~DecodePsbtInput((DecodePsbtInput *)local_730);
      uVar12 = uVar12 + 1;
    } while (uVar12 != local_9ac);
  }
  core::Amount::Amount((Amount *)local_ba0);
  core::Transaction::GetTxOutCount(&local_2c8);
  local_b80 = (vector<cfd::api::json::PsbtGlobalXpub,std::allocator<cfd::api::json::PsbtGlobalXpub>>
               *)&(local_bb0->outputs_).super_JsonVector<cfd::api::json::DecodePsbtOutput>.
                  super_vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
  ;
  uVar11 = 0;
  do {
    uVar12 = core::Transaction::GetTxOutCount(&local_2c8);
    if (uVar12 <= uVar11) {
      if (((local_b60 & 1) != 0) || (bVar8 = core::operator>((Amount *)local_ba0,&local_818), bVar8)
         ) {
        local_730 = (undefined1  [8])local_720;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"fee","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_bb0->ignore_items,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730);
        if (local_730 != (undefined1  [8])local_720) {
          operator_delete((void *)local_730);
        }
      }
      else {
        AVar20 = core::operator-(&local_818,(Amount *)local_ba0);
        local_730 = (undefined1  [8])AVar20.amount_;
        local_728[0] = CONCAT31(local_728[0]._1_3_,AVar20.ignore_check_);
        iVar15 = core::Amount::GetSatoshiValue((Amount *)local_730);
        local_bb0->fee_ = iVar15;
      }
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_b78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_778._M_dataplus._M_p != &local_778.field_2) {
        operator_delete(local_778._M_dataplus._M_p);
      }
      PsbtMapData::~PsbtMapData((PsbtMapData *)local_1f8);
      DecodeRawTransactionResponse::~DecodeRawTransactionResponse(&local_100);
      DecodeRawTransactionRequest::~DecodeRawTransactionRequest
                ((DecodeRawTransactionRequest *)local_180);
      core::Transaction::~Transaction(&local_2c8);
      core::Psbt::~Psbt(&local_8b8);
      local_758._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_758.prefix_list_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
        operator_delete(local_7b0._M_dataplus._M_p);
      }
      return;
    }
    DecodePsbtOutput::DecodePsbtOutput((DecodePsbtOutput *)local_730);
    core::Transaction::GetTxOut((TxOutReference *)local_288,&local_2c8,uVar11);
    local_b58 = (undefined1  [8])local_288._8_8_;
    paStack_b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(paStack_b50._1_7_,local_288[0x10]);
    core::Amount::operator+=((Amount *)local_ba0,(Amount *)local_b58);
    local_868.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = '\0';
    core::Psbt::GetTxOutScript((Script *)&local_800,&local_8b8,uVar11,true,(bool *)&local_868);
    bVar8 = core::Script::IsEmpty((Script *)&local_800);
    if (bVar8) {
      local_b58 = (undefined1  [8])local_b48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"redeem_script","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_728,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
      if (local_b58 != (undefined1  [8])local_b48) {
        operator_delete((void *)local_b58);
      }
      local_b58 = (undefined1  [8])local_b48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"witness_script","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_728,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
LAB_00464ea4:
      if (local_b58 != (undefined1  [8])local_b48) {
        operator_delete((void *)local_b58);
      }
    }
    else {
      if ((char)local_868.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                _M_impl.super__Vector_impl_data._M_start != '\x01') {
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"witness_script","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
        core::Script::GetHex_abi_cxx11_((string *)local_b58,(Script *)&local_800);
        std::__cxx11::string::_M_assign(local_6a0);
        if (local_b58 != (undefined1  [8])local_b48) {
          operator_delete((void *)local_b58);
        }
        core::Script::ToString_abi_cxx11_((string *)local_b58,(Script *)&local_800);
        std::__cxx11::string::_M_assign(local_6c0);
        goto LAB_00464ea4;
      }
      core::Script::GetHex_abi_cxx11_((string *)local_b58,(Script *)&local_800);
      std::__cxx11::string::_M_assign(local_608);
      if (local_b58 != (undefined1  [8])local_b48) {
        operator_delete((void *)local_b58);
      }
      core::Script::ToString_abi_cxx11_((string *)local_b58,(Script *)&local_800);
      std::__cxx11::string::_M_assign(local_628);
      if (local_b58 != (undefined1  [8])local_b48) {
        operator_delete((void *)local_b58);
      }
      core::Script::Script((Script *)local_b58,local_270);
      bVar8 = core::Script::IsP2shScript((Script *)local_b58);
      core::Script::~Script((Script *)local_b58);
      if (!bVar8) {
        local_b58 = (undefined1  [8])local_b48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"redeem_script","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_728,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
        goto LAB_00464ea4;
      }
      core::ScriptUtil::CreateP2wshLockingScript((Script *)local_b58,(Script *)&local_800);
      core::Script::GetHex_abi_cxx11_((string *)local_9a8,(Script *)local_b58);
      std::__cxx11::string::_M_assign(local_6a0);
      if (local_9a8 != (undefined1  [8])local_998) {
        operator_delete((void *)local_9a8);
      }
      core::Script::ToString_abi_cxx11_((string *)local_9a8,(Script *)local_b58);
      std::__cxx11::string::_M_assign(local_6c0);
      if (local_9a8 != (undefined1  [8])local_998) {
        operator_delete((void *)local_9a8);
      }
      core::Script::~Script((Script *)local_b58);
    }
    core::Psbt::GetTxOutKeyDataList
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_8f0,
               &local_8b8,uVar11);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_8f0._9_7_,local_8f0[8]);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8f0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f0._0_8_ == paVar13) {
      local_b58 = (undefined1  [8])local_b48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"bip32_derivs","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_728,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
      if (local_b58 != (undefined1  [8])local_b48) {
        operator_delete((void *)local_b58);
      }
    }
    else {
      do {
        core::KeyData::KeyData((KeyData *)local_b58,(KeyData *)paVar17);
        PsbtBip32Data::PsbtBip32Data((PsbtBip32Data *)local_9a8);
        core::KeyData::GetPubkey((Pubkey *)&local_850,(KeyData *)local_b58);
        core::Pubkey::GetHex_abi_cxx11_((string *)&local_9f0,(Pubkey *)&local_850);
        std::__cxx11::string::_M_assign(local_970);
        if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
            local_9f0.super_AbstractTransaction._vptr_AbstractTransaction != &local_9f0.vin_) {
          operator_delete(local_9f0.super_AbstractTransaction._vptr_AbstractTransaction);
        }
        if (local_850._vptr_Script != (_func_int **)0x0) {
          operator_delete(local_850._vptr_Script);
        }
        core::KeyData::GetFingerprint((ByteData *)&local_850,(KeyData *)local_b58);
        core::ByteData::GetHex_abi_cxx11_((string *)&local_9f0,(ByteData *)&local_850);
        std::__cxx11::string::_M_assign(local_950);
        if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
            local_9f0.super_AbstractTransaction._vptr_AbstractTransaction != &local_9f0.vin_) {
          operator_delete(local_9f0.super_AbstractTransaction._vptr_AbstractTransaction);
        }
        if (local_850._vptr_Script != (_func_int **)0x0) {
          operator_delete(local_850._vptr_Script);
        }
        core::KeyData::GetBip32Path_abi_cxx11_
                  ((string *)&local_9f0,(KeyData *)local_b58,kApostrophe,false);
        std::__cxx11::string::_M_assign(local_930);
        if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
            local_9f0.super_AbstractTransaction._vptr_AbstractTransaction != &local_9f0.vin_) {
          operator_delete(local_9f0.super_AbstractTransaction._vptr_AbstractTransaction);
        }
        if (local_ba8->has_detail_ == true) {
          core::KeyData::ToString_abi_cxx11_
                    ((string *)&local_9f0,(KeyData *)local_b58,true,kApostrophe,false);
          std::__cxx11::string::_M_assign(local_910);
        }
        else {
          local_9f0.super_AbstractTransaction._vptr_AbstractTransaction =
               (_func_int **)&local_9f0.vin_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f0,"descriptor","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&paStack_9a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_9f0
                    );
        }
        if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
            local_9f0.super_AbstractTransaction._vptr_AbstractTransaction != &local_9f0.vin_) {
          operator_delete(local_9f0.super_AbstractTransaction._vptr_AbstractTransaction);
        }
        std::vector<cfd::api::json::PsbtBip32Data,std::allocator<cfd::api::json::PsbtBip32Data>>::
        emplace_back<cfd::api::json::PsbtBip32Data&>(local_5c0,(PsbtBip32Data *)local_9a8);
        PsbtBip32Data::~PsbtBip32Data((PsbtBip32Data *)local_9a8);
        core::KeyData::~KeyData((KeyData *)local_b58);
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar17->_M_local_buf + 0x150);
      } while (paVar17 != paVar13);
    }
    core::Psbt::GetTxOutRecordKeyList
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_9a8,
               &local_8b8,uVar11);
    local_b48._0_8_ =
         local_b78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    paStack_b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b78.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
    local_b58 = (undefined1  [8])
                local_b78.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_start;
    local_b78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_998[0]._0_8_;
    local_b78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_9a8;
    local_b78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)paStack_9a0;
    local_9a8 = (undefined1  [8])0x0;
    paStack_9a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_998[0]._M_allocated_capacity = (pointer)0x0;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_b58);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_9a8);
    pBVar3 = local_b78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_b78.
                      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        paVar13 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pBVar3;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar13->_M_local_buf + 0x18)) {
      core::Psbt::GetTxOutRecord((ByteData *)local_9a8,&local_8b8,uVar11,(ByteData *)paVar13);
      core::ByteData::GetHex_abi_cxx11_((string *)local_b58,(ByteData *)paVar13);
      std::__cxx11::string::_M_assign((string *)(local_1f8 + 0x38));
      if (local_b58 != (undefined1  [8])local_b48) {
        operator_delete((void *)local_b58);
      }
      core::ByteData::GetHex_abi_cxx11_((string *)local_b58,(ByteData *)local_9a8);
      std::__cxx11::string::_M_assign(local_1a0);
      if (local_b58 != (undefined1  [8])local_b48) {
        operator_delete((void *)local_b58);
      }
      std::vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>>::
      emplace_back<cfd::api::json::PsbtMapData&>
                ((vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>> *)
                 &local_5a0,(PsbtMapData *)local_1f8);
      if (local_9a8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_9a8);
      }
    }
    if (local_5a0 == local_598) {
      local_b58 = (undefined1  [8])local_b48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b58,"unknown","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)local_728,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58);
      if (local_b58 != (undefined1  [8])local_b48) {
        operator_delete((void *)local_b58);
      }
    }
    std::vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
    ::push_back((vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
                 *)local_b80,(DecodePsbtOutput *)local_730);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_8f0);
    core::Script::~Script((Script *)&local_800);
    local_288._0_8_ = &PTR__AbstractTxOutReference_00723740;
    core::Script::~Script(local_270);
    DecodePsbtOutput::~DecodePsbtOutput((DecodePsbtOutput *)local_730);
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void PsbtJsonApi::DecodePsbt(
    DecodePsbtRequest* request, DecodePsbtResponse* response) {
  if (request == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "request is null.");
  }
  if (response == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "response is null.");
  }
  // validate input hex
  const std::string& hex_string = request->GetPsbt();
  if (hex_string.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to DecodePsbt. empty psbt.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid hex string. empty data.");
  }

  auto net_type = TransactionJsonApi::ConvertNetType(request->GetNetwork());
  AddressFactory addr_factory(net_type);

  // Decode transaction hex
  Psbt psbt(hex_string);
  Transaction tx = psbt.GetTransaction();

  DecodeRawTransactionRequest tx_req;
  DecodeRawTransactionResponse tx_res;
  PsbtMapData item;

  // global
  auto tx_hex = tx.GetHex();
  tx_req.SetHex(tx_hex);
  tx_req.SetNetwork(request->GetNetwork());
  TransactionJsonApi::DecodeRawTransaction(&tx_req, &tx_res);
  response->SetTx(tx_res);
  if (request->GetHasDetail()) {
    response->SetTx_hex(tx_hex);
    if (request->GetHasSimple()) response->SetIgnoreItem("tx");
  } else {
    response->SetIgnoreItem("tx_hex");
  }

  auto key_list = psbt.GetGlobalRecordKeyList();
    if (request->GetHasDetail()) {
      response->SetVersion(psbt.GetPsbtVersion());
      auto xpub_list = psbt.GetGlobalXpubkeyDataList();
      auto& xpubs = response->GetXpubs();
      for (const auto& xpub : xpub_list) {
        const auto& extkey = xpub.GetExtPubkey();
        PsbtGlobalXpub xpub_obj;
        auto& xpub_data = xpub_obj.GetXpub();
        xpub_data.SetBase58(extkey.ToString());
        xpub_data.SetHex(extkey.GetData().GetHex());
        xpub_obj.SetPath(xpub.GetBip32Path());
        xpub_obj.SetMaster_fingerprint(xpub.GetFingerprint().GetHex());
        xpub_obj.SetDescriptorXpub(xpub.ToString());
        xpubs.emplace_back(xpub_obj);
      }
      if (xpubs.empty()) response->SetIgnoreItem("xpubs");
    } else {
      response->SetIgnoreItem("version");
      response->SetIgnoreItem("xpubs");
      if (psbt.GetPsbtVersion() > 0) key_list.push_back(ByteData("fb"));
    }

  if (psbt.GetPsbtVersion() > 0) {
    key_list.push_back(ByteData("fb"));
  }
  auto& unknown_list = response->GetUnknown();
  for (const auto& key : key_list) {
      if (request->GetHasDetail() && (key.GetHeadData() == Psbt::kPsbtGlobalXpub)) {
        continue;
      }
    auto data = psbt.GetGlobalRecord(key);
    item.SetKey(key.GetHex());
    item.SetValue(data.GetHex());
    unknown_list.emplace_back(item);
  }
  if (request->GetHasSimple() && unknown_list.empty()) {
    response->SetIgnoreItem("unknown");
  }

  Amount total_input;
  bool is_unset_utxo = false;
  uint32_t max = static_cast<uint32_t>(tx.GetTxInCount());
  for (uint32_t index=0; index<max; ++index) {
    DecodePsbtInput input;
    auto tx_input = tx.GetTxIn(index);
    bool has_amount = false;
      bool is_witness = false;

    auto utxo = psbt.GetTxInUtxo(index, true, &is_witness);
    if (utxo.GetLockingScript().IsEmpty() || (!is_witness)) {
      input.SetIgnoreItem("witness_utxo");
    } else {
      has_amount = true;
      total_input += utxo.GetValue();
      input.GetWitness_utxo().SetAmount(utxo.GetValue().GetSatoshiValue());
      auto& script = input.GetWitness_utxo().GetScriptPubKey();

      std::string script_type;
      auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
          addr_factory, utxo.GetLockingScript(), &script_type, nullptr);
      if (!addr_list.empty()) {
        script.SetAddress(addr_list[0].GetAddress());
      }
      script.SetHex(utxo.GetLockingScript().GetHex());
      script.SetAsm(utxo.GetLockingScript().ToString());
      script.SetType(script_type);
    }

    auto full_utxo = psbt.GetTxInUtxoFull(index, true);
    if (!full_utxo.GetTxid().Equals(tx_input.GetTxid())) {
      input.SetIgnoreItem("non_witness_utxo");
      input.SetIgnoreItem("non_witness_utxo_hex");
      if (!has_amount) is_unset_utxo = true;
    } else {
      auto utxo_tx_hex = full_utxo.GetHex();
      tx_req.SetHex(utxo_tx_hex);
      tx_req.SetNetwork(request->GetNetwork());
      TransactionJsonApi::DecodeRawTransaction(&tx_req, &tx_res);
      input.SetNon_witness_utxo(tx_res);

      if (request->GetHasDetail()) {
        input.SetNon_witness_utxo_hex(utxo_tx_hex);
        if (utxo_tx_hex.empty()) {
          input.SetIgnoreItem("non_witness_utxo_hex");
        }
        if (request->GetHasSimple()) {
          input.SetIgnoreItem("non_witness_utxo");
        }
      } else {
        input.SetIgnoreItem("non_witness_utxo_hex");
      }
      if (has_amount) {
        // do nothing
      } else if (full_utxo.GetTxOutCount() > tx_input.GetVout()) {
        auto txout = full_utxo.GetTxOut(tx_input.GetVout());
        total_input += txout.GetValue();
        has_amount = true;
      } else {
        input.SetIgnoreItem("non_witness_utxo");
        is_unset_utxo = true;
      }
    }

    auto sig_pubkey_list = psbt.GetTxInSignaturePubkeyList(index);
    if (sig_pubkey_list.empty()) {
      input.SetIgnoreItem("partial_signatures");
    } else {
      auto& sig_list = input.GetPartial_signatures();
      for (auto pubkey : sig_pubkey_list) {
        auto sig = psbt.GetTxInSignature(index, pubkey);
        PsbtSignatureData sig_data;
        sig_data.SetPubkey(pubkey.GetHex());
        sig_data.SetSignature(sig.GetHex());
        sig_list.emplace_back(sig_data);
      }
    }

    if (!psbt.IsFindTxInSighashType(index)) {
      input.SetIgnoreItem("sighash");
    } else {
      auto sighashtype = psbt.GetTxInSighashType(index);
      input.SetSighash(sighashtype.ToString());
    }

    Script redeem_script = psbt.GetTxInRedeemScriptDirect(index, true, false);
    if (redeem_script.IsEmpty()) {
      input.SetIgnoreItem("redeem_script");
    } else {
      std::string script_type;
      auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
          addr_factory, redeem_script, &script_type, nullptr);
      input.GetRedeem_script().SetHex(redeem_script.GetHex());
      input.GetRedeem_script().SetAsm(redeem_script.ToString());
      input.GetRedeem_script().SetType(script_type);
    }

    Script witness_script = psbt.GetTxInRedeemScriptDirect(index, true, true);
    if (witness_script.IsEmpty()) {
      input.SetIgnoreItem("witness_script");
    } else {
      std::string script_type;
      auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
          addr_factory, witness_script, &script_type, nullptr);
      input.GetWitness_script().SetHex(witness_script.GetHex());
      input.GetWitness_script().SetAsm(witness_script.ToString());
      input.GetWitness_script().SetType(script_type);
    }

    auto bip32_pubkey_list = psbt.GetTxInKeyDataList(index);
    if (bip32_pubkey_list.empty()) {
      input.SetIgnoreItem("bip32_derivs");
    } else {
      auto& bip32_list = input.GetBip32_derivs();
      for (auto key_data : bip32_pubkey_list) {
        PsbtBip32Data bip32_data;
        bip32_data.SetPubkey(key_data.GetPubkey().GetHex());
        bip32_data.SetMaster_fingerprint(key_data.GetFingerprint().GetHex());
        bip32_data.SetPath(key_data.GetBip32Path());
        
          if (request->GetHasDetail()) {
            bip32_data.SetDescriptor(key_data.ToString());
          } else {
            bip32_data.SetIgnoreItem("descriptor");
          }
        bip32_list.emplace_back(bip32_data);
      }
    }

    auto scriptsig_arr = psbt.GetTxInFinalScript(index, false);
    if ((!scriptsig_arr.empty()) && (!scriptsig_arr[0].IsEmpty())) {
      input.GetFinal_scriptsig().SetHex(scriptsig_arr[0].GetHex());
      input.GetFinal_scriptsig().SetAsm(Script(scriptsig_arr[0]).ToString());
    } else {
      input.SetIgnoreItem("final_scriptsig");
    }

    auto witness_stack = psbt.GetTxInFinalScript(index, true);
    if (witness_stack.empty()) {
      input.SetIgnoreItem("final_scriptwitness");
    } else {
      auto& witness = input.GetFinal_scriptwitness();
      for (const auto& stack : witness_stack) {
        witness.emplace_back(stack.GetHex());
      }
    }

    key_list = psbt.GetTxInRecordKeyList(index);
    for (const auto& key : key_list) {
      auto data = psbt.GetTxInRecord(index, key);
      item.SetKey(key.GetHex());
      item.SetValue(data.GetHex());
      input.GetUnknown().emplace_back(item);
    }
    if (input.GetUnknown().empty()) input.SetIgnoreItem("unknown");

    response->GetInputs().push_back(input);
  }

  Amount total_output;
  max = static_cast<uint32_t>(tx.GetTxOutCount());
  for (uint32_t index=0; index<tx.GetTxOutCount(); ++index) {
    DecodePsbtOutput output;
    const auto& txout = tx.GetTxOut(index);
    total_output += txout.GetValue();
    bool is_witness = false;
    auto script = psbt.GetTxOutScript(index, true, &is_witness);
    if (script.IsEmpty()) {
      output.SetIgnoreItem("redeem_script");
      output.SetIgnoreItem("witness_script");
    } else if (is_witness) {
      output.GetWitness_script().SetHex(script.GetHex());
      output.GetWitness_script().SetAsm(script.ToString());
      if (txout.GetLockingScript().IsP2shScript()) {
        auto sh_script = ScriptUtil::CreateP2wshLockingScript(script);
        output.GetRedeem_script().SetHex(sh_script.GetHex());
        output.GetRedeem_script().SetAsm(sh_script.ToString());
      } else {
        output.SetIgnoreItem("redeem_script");
      }
    } else {
      output.SetIgnoreItem("witness_script");
      output.GetRedeem_script().SetHex(script.GetHex());
      output.GetRedeem_script().SetAsm(script.ToString());
    }

    auto bip32_pubkey_list = psbt.GetTxOutKeyDataList(index);
    if (bip32_pubkey_list.empty()) {
      output.SetIgnoreItem("bip32_derivs");
    } else {
      auto& bip32_list = output.GetBip32_derivs();
      for (auto key_data : bip32_pubkey_list) {
        PsbtBip32Data bip32_data;
        bip32_data.SetPubkey(key_data.GetPubkey().GetHex());
        bip32_data.SetMaster_fingerprint(key_data.GetFingerprint().GetHex());
        bip32_data.SetPath(key_data.GetBip32Path());
        
          if (request->GetHasDetail()) {
            bip32_data.SetDescriptor(key_data.ToString());
          } else {
            bip32_data.SetIgnoreItem("descriptor");
          }
        bip32_list.emplace_back(bip32_data);
      }
    }

    key_list = psbt.GetTxOutRecordKeyList(index);
    for (const auto& key : key_list) {
      auto data = psbt.GetTxOutRecord(index, key);
      item.SetKey(key.GetHex());
      item.SetValue(data.GetHex());
      output.GetUnknown().emplace_back(item);
    }
    if (output.GetUnknown().empty()) output.SetIgnoreItem("unknown");

    response->GetOutputs().push_back(output);
  }

  if (is_unset_utxo || (total_output > total_input)) {
    response->SetIgnoreItem("fee");
  } else {
    response->SetFee((total_input - total_output).GetSatoshiValue());
  }
}